

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O2

void __thiscall CTcLibParser::parse_lib(CTcLibParser *this)

{
  CTcSrcFile *pCVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  long lVar9;
  char buf2 [128];
  char buf [1024];
  char expbuf [1024];
  undefined8 local_8c0;
  undefined1 local_8b8 [127];
  char acStack_839 [1024];
  char local_439;
  char local_438 [1024];
  undefined1 auStack_38 [8];
  
  local_8c0 = CTcSrcFile::open_ascii(this->lib_name_);
  if (local_8c0 == (CTcSrcFile *)0x0) {
    (*this->_vptr_CTcLibParser[2])(this);
    this->err_cnt_ = this->err_cnt_ + 1;
  }
  else {
LAB_001f7d55:
    pCVar1 = local_8c0;
    iVar2 = (*(local_8c0->super_CTcSrcObject)._vptr_CTcSrcObject[2])
                      (local_8c0,acStack_839 + 1,0x400);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      this->linenum_ = this->linenum_ + 1;
      lVar9 = CONCAT44(extraout_var,iVar2) + -1;
      do {
        lVar4 = lVar9;
        if (lVar4 == 0) break;
        lVar9 = lVar4 + -1;
      } while ((acStack_839[lVar4] == '\r') || (acStack_839[lVar4] == '\n'));
      if (acStack_839[lVar4 + 1] != '\0') {
LAB_001f7da7:
        acStack_839[lVar4 + 1] = '\0';
        pcVar5 = local_438;
        pcVar6 = acStack_839;
LAB_001f7dc3:
        pcVar6 = pcVar6 + 1;
        if (*pcVar6 == '$') goto LAB_001f7dd5;
        if (*pcVar6 != '\0') goto LAB_001f7e0d;
        goto LAB_001f7e8f;
      }
      iVar2 = (*(pCVar1->super_CTcSrcObject)._vptr_CTcSrcObject[2])(pCVar1,local_8b8,0x80);
      lVar9 = CONCAT44(extraout_var_00,iVar2);
      if (lVar9 == 0) goto LAB_001f7da7;
      (*this->_vptr_CTcLibParser[3])(this);
      this->err_cnt_ = this->err_cnt_ + 1;
      do {
        if ((lVar9 != 1) && ((cVar8 = local_8b8[lVar9 + -2], cVar8 == '\n' || (cVar8 == '\r'))))
        break;
        iVar2 = (*(pCVar1->super_CTcSrcObject)._vptr_CTcSrcObject[2])(pCVar1,local_8b8,0x80);
        lVar9 = CONCAT44(extraout_var_01,iVar2);
      } while (lVar9 != 0);
      goto LAB_001f7d55;
    }
    (*(pCVar1->super_CTcSrcObject)._vptr_CTcSrcObject[1])(pCVar1);
  }
  return;
LAB_001f7dd5:
  if (pcVar6[1] == '$') {
    pcVar6 = pcVar6 + 1;
  }
  else {
    if (pcVar6[1] == '(') {
      pcVar7 = pcVar6 + 2;
      for (lVar9 = 0; pcVar7[lVar9] != '\0'; lVar9 = lVar9 + 1) {
        if (pcVar7[lVar9] == ')') {
          uVar3 = (*this->_vptr_CTcLibParser[0x15])
                            (this,pcVar5,auStack_38 + -(long)pcVar5,pcVar7,lVar9);
          pcVar6 = pcVar7 + lVar9;
          if ((int)uVar3 < 0) {
            (*this->_vptr_CTcLibParser[7])(this,pcVar7,lVar9);
          }
          else {
            if (auStack_38 + -(long)pcVar5 < (undefined1 *)(ulong)uVar3) goto LAB_001f7e86;
            pcVar5 = pcVar5 + (long)(ulong)uVar3;
          }
          goto LAB_001f7dc3;
        }
      }
    }
    (*this->_vptr_CTcLibParser[8])(this);
  }
LAB_001f7e0d:
  if ((char *)0xfffffffffffffbfe < pcVar5 + (-0x3ff - (long)local_438)) {
    *pcVar5 = *pcVar6;
    pcVar5 = pcVar5 + 1;
    goto LAB_001f7dc3;
  }
LAB_001f7e86:
  (*this->_vptr_CTcLibParser[4])(this);
LAB_001f7e8f:
  *pcVar5 = '\0';
  pcVar6 = &local_439;
  do {
    pcVar5 = pcVar6;
    pcVar6 = pcVar5 + 1;
    cVar8 = pcVar5[1];
    iVar2 = isspace((int)cVar8);
  } while (iVar2 != 0);
  if ((cVar8 != '\0') && (pcVar7 = pcVar6, cVar8 != '#')) {
    while ((cVar8 != '\0' && ((cVar8 != ':' && (iVar2 = isspace((int)cVar8), iVar2 == 0))))) {
      cVar8 = pcVar7[1];
      pcVar5 = pcVar5 + 1;
      pcVar7 = pcVar7 + 1;
    }
    do {
      cVar8 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
      iVar2 = isspace((int)cVar8);
    } while (iVar2 != 0);
    if (cVar8 == ':') {
      *pcVar7 = '\0';
      do {
        pcVar7 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
        iVar2 = isspace((int)*pcVar7);
      } while (iVar2 != 0);
      (*this->_vptr_CTcLibParser[0xb])(this,pcVar6,pcVar5);
    }
    else {
      iVar2 = stricmp(pcVar6,"nodef");
      if (iVar2 == 0) {
        (*this->_vptr_CTcLibParser[0x16])(this);
      }
      else {
        (*this->_vptr_CTcLibParser[5])();
        this->err_cnt_ = this->err_cnt_ + 1;
      }
    }
  }
  goto LAB_001f7d55;
}

Assistant:

void CTcLibParser::parse_lib()
{
    CTcSrcFile *fp;

    /* open our file - we only accept plain ASCII here */
    fp = CTcSrcFile::open_ascii(lib_name_);

    /* if that failed, abort */
    if (fp == 0)
    {
        err_open_file();
        ++err_cnt_;
        return;
    }

    /* keep going until we run out of file */
    for (;;)
    {
        char buf[1024];
        char expbuf[1024];
        size_t len;
        char *p;
        char *dst;
        char *sep;
        char *var_name;
        char *var_val;

        /* read the next line of text */
        if ((len = fp->read_line(buf, sizeof(buf))) == 0)
            break;

        /* count the line */
        ++linenum_;

        /* un-count the terminating null byte in the length */
        --len;

        /* check for a terminating newline sequence */
        while (len != 0 && (buf[len-1] == '\n' || buf[len-1] == '\r'))
            --len;

        /* if we didn't find a newline, the line is too long */
        if (buf[len] == '\0')
        {
            char buf2[128];
            size_t len2;
            
            /* 
             *   If we can read anything more from the file, this indicates
             *   that the line was simply too long to read into our buffer;
             *   skip the rest of the line and log an error in this case.
             *   If we can't read any more text, it means we've reached the
             *   end of the file. 
             */
            if ((len2 = fp->read_line(buf2, sizeof(buf2))) != 0)
            {
                /* there's more, so the line is too long - flag an error */
                err_line_too_long();
                ++err_cnt_;

                /* skip text until we find a newline */
                for (;;)
                {
                    /* un-count the null terminator */
                    --len2;

                    /* if we've found our newline, we're done skipping */
                    if (len2 != 0
                        && (buf2[len2-1] == '\n' || buf2[len2-1] == '\r'))
                        break;
                    
                    /* read another chunk */
                    if ((len2 = fp->read_line(buf2, sizeof(buf2))) == 0)
                        break;
                }

                /* we've skipped the line, so go back for the next */
                continue;
            }
        }

        /* remove the newline from the buffer */
        buf[len] = '\0';

        /* scan for and expand preprocessor symbols */
        for (p = buf, dst = expbuf ; *p != '\0' ; ++p)
        {
            /* check for the start of a preprocessor symbol */
            if (*p == '$')
            {
                /* 
                 *   We have a dollar sign, so this *could* be a preprocessor
                 *   symbol.  If the next character is '(', then find the
                 *   matching ')', and take the part between the parentheses
                 *   as a symbol to expand.  If the next character is '$',
                 *   replace the pair with a single dollar sign.  If the next
                 *   character is anything else, the '$' is not significant,
                 *   so leave it as it is.  
                 */
                if (*(p+1) == '(')
                {
                    char *closep;

                    /* find the close paren */
                    for (closep = p + 2 ; *closep != '\0' && *closep != ')' ;
                         ++closep) ;

                    /* 
                     *   if we found the close paren, process it; if not,
                     *   just ignore the whole thing and treat the '$(' as a
                     *   pair of ordinary characters 
                     */
                    if (*closep == ')')
                    {
                        int vallen;
                        size_t symlen;
                        size_t rem;

                        /* skip to the start of the symbol name */
                        p += 2;

                        /* get the length of the symbol */
                        symlen = closep - p;

                        /* figure out how much space we have left */
                        rem = sizeof(expbuf) - (dst - expbuf);

                        /* look up the symbol's value */
                        vallen = get_pp_symbol(dst, rem, p, symlen);

                        /* note overflow or undefined symbol errors */
                        if (vallen < 0)
                        {
                            /* it's undefined - note it */
                            err_undef_sym(p, symlen);
                        }
                        else if ((size_t)vallen > rem)
                        {
                            /* it's too long - note it and give up now */
                            err_expanded_line_too_long();
                            break;
                        }
                        else
                        {
                            /* success - advance past the value */
                            dst += vallen;
                        }

                        /* 
                         *   Skip to the close paren and continue with the
                         *   main loop.  We don't need to copy any input for
                         *   the symbol, because we've already copied the
                         *   expansion instead; so just go back to the start
                         *   of the input loop.  
                         */
                        p = closep;
                        continue;
                    }
                    else
                    {
                        /* ill-formed macro substitution expression */
                        err_invalid_dollar();
                    }
                }
                else if (*(p+1) == '$')
                {
                    /* 
                     *   we have a double dollar sign, so turn it into a
                     *   single dollar sign - simply skip the first of the
                     *   pair so we only keep one 
                     */
                    ++p;
                }
                else
                {
                    /* invalid '$' sequence - warn about it */
                    err_invalid_dollar();
                }
            }

            /* make sure we have room for this character plus a null byte */
            if ((dst - expbuf) + 2 > sizeof(expbuf))
            {
                err_expanded_line_too_long();
                break;
            }

            /* copy this character to the destination string */
            *dst++ = *p;
        }

        /* null-terminate the expanded buffer */
        *dst = '\0';

        /* skip leading spaces */
        for (p = expbuf ; isspace(*p) ; ++p) ;

        /* if the line is empty or starts with '#', skip it */
        if (*p == '\0' || *p == '#')
            continue;

        /* the variable name starts here */
        var_name = p;

        /* the variable name ends at the next space or colon */
        for ( ; *p != '\0' && *p != ':' && !isspace(*p) ; ++p) ;

        /* note where the variable name ends */
        sep = p;

        /* skip spaces after the end of the variable name */
        for ( ; isspace(*p) ; ++p) ;

        /* 
         *   if we didn't find a colon after the variable name, it's an
         *   error; flag the error and skip the line 
         */
        if (*p != ':')
        {
            /* check for stand-alone flags */
            if (stricmp(var_name, "nodef") == 0)
            {
                /* scan the "nodef" flag */
                scan_nodef();
            }
            else
            {
                /* 
                 *   it's not a valid stand-alone flag; the definition must
                 *   be missing the value portion 
                 */
                err_missing_colon();
                ++err_cnt_;
            }

            /* we're done with this line now */
            continue;
        }

        /* put a null terminator at the end of the variable name */
        *sep = '\0';

        /* skip any spaces after the colon */
        for (++p ; isspace(*p) ; ++p) ;

        /* the value starts here */
        var_val = p;

        /* scan the value */
        scan_var(var_name, var_val);
    }

    /* we're done - close the file */
    delete fp;
}